

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

size_t lua_objlen(lua_State *L,int idx)

{
  int iVar1;
  TValue *obj;
  Table *pTVar2;
  
  obj = index2adr(L,idx);
  pTVar2 = (Table *)0x0;
  switch(obj->tt) {
  case 3:
    iVar1 = luaV_tostring(L,obj);
    if (iVar1 == 0) {
      return 0;
    }
  case 4:
    pTVar2 = (((obj->value).gc)->h).metatable;
    break;
  case 5:
    iVar1 = luaH_getn(&((obj->value).gc)->h);
    pTVar2 = (Table *)(long)iVar1;
    break;
  case 7:
    pTVar2 = (Table *)(((obj->value).gc)->h).node;
  }
  return (size_t)pTVar2;
}

Assistant:

static size_t lua_objlen(lua_State*L,int idx){
StkId o=index2adr(L,idx);
switch(ttype(o)){
case 4:return tsvalue(o)->len;
case 7:return uvalue(o)->len;
case 5:return luaH_getn(hvalue(o));
case 3:{
size_t l;
l=(luaV_tostring(L,o)?tsvalue(o)->len:0);
return l;
}
default:return 0;
}
}